

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::AddString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  int number;
  bool bVar1;
  CppStringType CVar2;
  uint32_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *description;
  Descriptor *pDVar4;
  string_view src;
  Metadata MVar5;
  Cord local_60;
  string local_50;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection != this) {
    pDVar4 = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,MVar5.descriptor,field,"AddString");
  }
  pDVar4 = this->descriptor_;
  if (field->containing_type_ == pDVar4) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"AddString",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) == 0) {
        CVar2 = FieldDescriptor::cpp_string_type(field);
        if ((CVar2 == kView) || (CVar2 == kString)) {
          this_00 = AddField<std::__cxx11::string>(this,message,field);
          std::__cxx11::string::operator=((string *)this_00,(string *)value);
          return;
        }
        if (CVar2 == kCord) {
          src._M_str = (value->_M_dataplus)._M_p;
          src._M_len = value->_M_string_length;
          absl::lts_20250127::Cord::Cord(&local_60,src);
          AddField<absl::lts_20250127::Cord>(this,message,field,&local_60);
          absl::lts_20250127::Cord::~Cord(&local_60);
        }
      }
      else {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        bVar1 = FieldDescriptor::requires_utf8_validation(field);
        std::__cxx11::string::string((string *)&local_50,(string *)value);
        internal::ExtensionSet::AddString
                  ((ExtensionSet *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),number,
                   !bVar1 * '\x03' + '\t',&local_50,field);
        std::__cxx11::string::~string((string *)&local_50);
      }
      return;
    }
    pDVar4 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar4,field,"AddString",description);
}

Assistant:

void Reflection::AddString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(AddString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddString(field->number(),
                                            field->requires_utf8_validation()
                                                ? FieldDescriptor::TYPE_STRING
                                                : FieldDescriptor::TYPE_BYTES,
                                            std::move(value), field);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        AddField<absl::Cord>(message, field, absl::Cord(value));
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        AddField<std::string>(message, field)->assign(std::move(value));
        break;
    }
  }
}